

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int cd_time_add_mapping(parser_info *info)

{
  int iVar1;
  
  iVar1 = coda_type_time_add_ascii_float_mapping
                    ((coda_type_special *)info->node->parent->data,
                     (coda_ascii_float_mapping *)info->node->data);
  if (iVar1 == 0) {
    info->node->data = (void *)0x0;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int cd_time_add_mapping(parser_info *info)
{
    if (coda_type_time_add_ascii_float_mapping((coda_type_special *)info->node->parent->data,
                                               (coda_ascii_float_mapping *)info->node->data) != 0)
    {
        return -1;
    }
    info->node->data = NULL;
    return 0;
}